

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O3

bool __thiscall
QMetaTypeFunctionRegistry<std::function<bool_(void_*,_void_*)>,_std::pair<int,_int>_>::
insertIfNotContains(QMetaTypeFunctionRegistry<std::function<bool_(void_*,_void_*)>,_std::pair<int,_int>_>
                    *this,pair<int,_int> k,function<bool_(void_*,_void_*)> *f)

{
  bool bVar1;
  long in_FS_OFFSET;
  pair<int,_int> local_50;
  undefined1 local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = k;
  QReadWriteLock::lockForWrite((QReadWriteLock *)this);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHash<std::pair<int,int>,std::function<bool(void*,void*)>>::
  tryEmplace_impl<std::pair<int,int>const&,std::function<bool(void*,void*)>const&>
            ((TryEmplaceResult *)local_48,
             (QHash<std::pair<int,int>,std::function<bool(void*,void*)>> *)(this + 8),&local_50,f);
  bVar1 = local_48[0x10];
  QReadWriteLock::unlock((QReadWriteLock *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool insertIfNotContains(Key k, const T &f)
    {
        const QWriteLocker locker(&lock);
        auto r = map.tryEmplace(k, f);
        return r.inserted;
    }